

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O0

void __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
::expand(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
         *this)

{
  void *__ptr;
  uint uVar1;
  void *pvVar2;
  long lVar3;
  uint *in_RDI;
  Binding *ntp;
  Binding *otp;
  void *mem;
  Binding *oldData;
  uint oldCapacity;
  undefined4 in_stack_ffffffffffffffc0;
  long local_30;
  void *local_28;
  
  __ptr = *(void **)(in_RDI + 2);
  if (in_RDI[1] == 0) {
    uVar1 = 4;
  }
  else {
    uVar1 = in_RDI[1] << 1;
  }
  in_RDI[1] = uVar1;
  pvVar2 = Lib::alloc(CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  *(void **)(in_RDI + 2) = pvVar2;
  *(long *)(in_RDI + 4) = *(long *)(in_RDI + 2) + -0x10;
  if (*in_RDI != 0) {
    local_30 = *(long *)(in_RDI + 2) + (ulong)*in_RDI * 0x10;
    local_28 = (void *)((long)__ptr + (ulong)*in_RDI * 0x10);
    do {
      lVar3 = local_30 + -0x10;
      *(undefined8 *)(local_30 + -0x10) = *(undefined8 *)((long)local_28 + -0x10);
      *(undefined8 *)(local_30 + -8) = *(undefined8 *)((long)local_28 + -8);
      local_30 = lVar3;
      local_28 = (void *)((long)local_28 + -0x10);
    } while (lVar3 != *(long *)(in_RDI + 2));
  }
  if (__ptr != (void *)0x0) {
    Lib::free(__ptr);
  }
  return;
}

Assistant:

void expand()
  {
    ASS(_capacity==_size);

    unsigned oldCapacity=_capacity;
    T* oldData=_data;

    _capacity= _capacity ? _capacity*2 : 4;

    void* mem = ALLOC_KNOWN(_capacity*sizeof(T),"BinaryHeap::T");
    _data = static_cast<T*>(mem);
    _data1 = _data-1;

    if(_size) {
      T* otp = oldData+_size;
      T* ntp = _data+_size;
      do {
	::new (--ntp) T(*(--otp));
	//because oldCapacity==_size, we destroy all elements of oldData array here
	otp->~T();
      } while(ntp!=_data);
    }

    if(oldData) {
      DEALLOC_KNOWN(oldData,oldCapacity*sizeof(T),"BinaryHeap::T");
    }
  }